

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ElementSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,int32_t index,ASTContext *context)

{
  long lVar1;
  SourceRange valueRange;
  bool bVar2;
  ulong uVar3;
  Type *args;
  ElementSelectExpression *this;
  Expression *pEVar4;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  ushort local_34;
  Expression *indexExpr;
  
  local_40 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)index;
  local_34 = 1;
  uVar3 = (ulong)(index >> 0x1f ^ index);
  if (uVar3 == 0) {
    local_38 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_38 = (uint)lVar1 ^ 0x3f;
  }
  local_38 = 0x41 - local_38;
  SVInt::clearUnusedBits((SVInt *)&local_40);
  indexExpr = IntegerLiteral::fromConstant(compilation,(SVInt *)&local_40);
  if (((0x40 < local_38) || ((local_34 & 0x100) != 0)) && ((void *)local_40.val != (void *)0x0)) {
    operator_delete__(local_40.pVal);
  }
  Expression::selfDetermined(context,&indexExpr);
  valueRange.endLoc = (SourceLocation)0x0;
  valueRange.startLoc = (value->sourceRange).endLoc;
  args = getIndexedType(compilation,context,(value->type).ptr,indexExpr->sourceRange,valueRange,
                        SUB81((value->sourceRange).startLoc,0));
  this = BumpAllocator::
         emplace<slang::ast::ElementSelectExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,args,value,indexExpr,&value->sourceRange);
  bVar2 = Expression::bad(value);
  if (((!bVar2) && (bVar2 = Expression::bad(indexExpr), !bVar2)) &&
     (bVar2 = Expression::bad(&this->super_Expression), !bVar2)) {
    return &this->super_Expression;
  }
  pEVar4 = Expression::badExpr(compilation,&this->super_Expression);
  return pEVar4;
}

Assistant:

Expression& ElementSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                  int32_t index, const ASTContext& context) {
    Expression* indexExpr = &IntegerLiteral::fromConstant(compilation, index);
    selfDetermined(context, indexExpr);

    const Type& resultType = getIndexedType(compilation, context, *value.type,
                                            indexExpr->sourceRange, value.sourceRange, false);

    auto result = compilation.emplace<ElementSelectExpression>(resultType, value, *indexExpr,
                                                               value.sourceRange);
    if (value.bad() || indexExpr->bad() || result->bad())
        return badExpr(compilation, result);

    return *result;
}